

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_signal.h
# Opt level: O3

void __thiscall
sc_core::sc_signal_t<sc_dt::sc_logic,_(sc_core::sc_writer_policy)0>::update
          (sc_signal_t<sc_dt::sc_logic,_(sc_core::sc_writer_policy)0> *this)

{
  int *piVar1;
  sc_process_b *this_00;
  
  if ((this->super_sc_writer_policy_check<(sc_core::sc_writer_policy)0>).
      super_sc_writer_policy_check_write.m_delta_only == true) {
    this_00 = (this->super_sc_writer_policy_check<(sc_core::sc_writer_policy)0>).
              super_sc_writer_policy_check_write.m_writer_p.m_target_p;
    (this->super_sc_writer_policy_check<(sc_core::sc_writer_policy)0>).
    super_sc_writer_policy_check_write.m_writer_p.m_target_p = (sc_process_b *)0x0;
    if (this_00 != (sc_process_b *)0x0) {
      piVar1 = &this_00->m_references_n;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        sc_process_b::delete_process(this_00);
      }
    }
  }
  if ((this->m_new_val).m_val != (this->m_cur_val).m_val) {
    sc_signal_channel::notify_next_delta
              (&this->super_sc_signal_channel,(this->super_sc_signal_channel).m_change_event_p);
    (this->super_sc_signal_channel).m_change_stamp =
         ((this->super_sc_signal_channel).super_sc_prim_channel.super_sc_object.m_simc)->
         m_change_stamp;
    (this->m_cur_val).m_val = (this->m_new_val).m_val;
  }
  return;
}

Assistant:

void
sc_signal_t<T,POL>::update()
{
    policy_type::update();
    if( !( m_new_val == m_cur_val ) ) {
        do_update();
    }
}